

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsc.c
# Opt level: O0

request_t * new_request(bsc_step_t step)

{
  uint uVar1;
  uint uVar2;
  state_t *psVar3;
  uint *puVar4;
  request_t *prVar5;
  uint uVar6;
  uint local_60;
  uint local_5c;
  uint b;
  uint a;
  request_t *new_queue;
  uint new_max_requests;
  uint *new_n_requests;
  bsc_step_t new_horizon;
  state_t *sbsc;
  request_t *entry;
  uint delay;
  uint j;
  uint i;
  bsc_step_t step_local;
  
  psVar3 = bsc();
  if (step < psVar3->current) {
    bsp_abort("bsc: a flush sync is required before posting another request. Requested superstep %d comes before current step %d\n"
              ,(ulong)step,(ulong)psVar3->current);
  }
  uVar2 = step - psVar3->current;
  if ((psVar3->horizon <= uVar2) ||
     (psVar3->max_requests_per_step <=
      psVar3->n_requests[(ulong)(psVar3->queue_start + uVar2) % (ulong)psVar3->horizon])) {
    new_n_requests._4_4_ = psVar3->horizon;
    if (psVar3->horizon <= uVar2) {
      if (psVar3->horizon << 1 < uVar2 + 1) {
        local_5c = uVar2 + 1;
      }
      else {
        local_5c = psVar3->horizon << 1;
      }
      new_n_requests._4_4_ = local_5c;
    }
    if (new_n_requests._4_4_ <= uVar2) {
      bsp_abort("bsc: cannot plan that far in the futuredue to integer overflow\n");
    }
    puVar4 = (uint *)calloc((ulong)new_n_requests._4_4_,4);
    if (puVar4 == (uint *)0x0) {
      bsp_abort("bsc: insufficient memory; cannot allocate %u x %u bytes\n",
                (ulong)new_n_requests._4_4_,4);
    }
    for (delay = 0; delay < psVar3->horizon; delay = delay + 1) {
      puVar4[delay] = psVar3->n_requests[(psVar3->queue_start + delay) % psVar3->horizon];
    }
    new_queue._4_4_ = psVar3->max_requests_per_step;
    if (new_queue._4_4_ <= puVar4[uVar2]) {
      if (psVar3->max_requests_per_step << 1 < puVar4[uVar2] + 1) {
        local_60 = puVar4[uVar2] + 1;
      }
      else {
        local_60 = psVar3->max_requests_per_step << 1;
      }
      new_queue._4_4_ = local_60;
    }
    if (new_queue._4_4_ <= puVar4[uVar2]) {
      bsp_abort("bsc: cannot plan that far in the futuredue to integer overflow\n");
    }
    prVar5 = (request_t *)calloc((ulong)new_n_requests._4_4_ * (ulong)new_queue._4_4_,0x58);
    for (delay = 0; delay < psVar3->horizon; delay = delay + 1) {
      for (entry._4_4_ = 0; entry._4_4_ < psVar3->max_requests_per_step;
          entry._4_4_ = entry._4_4_ + 1) {
        memcpy(prVar5 + (delay * new_queue._4_4_ + entry._4_4_),
               psVar3->queue +
               (((delay + psVar3->queue_start) % psVar3->horizon) * psVar3->max_requests_per_step +
               entry._4_4_),0x58);
      }
    }
    free(psVar3->n_requests);
    free(psVar3->queue);
    psVar3->n_requests = puVar4;
    psVar3->queue = prVar5;
    psVar3->horizon = new_n_requests._4_4_;
    psVar3->max_requests_per_step = new_queue._4_4_;
    psVar3->queue_start = 0;
  }
  uVar6 = (uVar2 + psVar3->queue_start) % psVar3->horizon;
  prVar5 = psVar3->queue;
  uVar2 = psVar3->max_requests_per_step;
  uVar1 = psVar3->n_requests[uVar6];
  psVar3->n_requests[uVar6] = psVar3->n_requests[uVar6] + 1;
  psVar3->total_n_outstanding_requests = psVar3->total_n_outstanding_requests + 1;
  return prVar5 + (ulong)(uVar6 * uVar2) + (ulong)uVar1;
}

Assistant:

static request_t * new_request( bsc_step_t step ) 
{
    unsigned i, j, delay;
    request_t * entry;
    state_t * const sbsc = bsc();

    if ( step < sbsc->current )
        bsp_abort("bsc: a flush sync is required before posting"
                  " another request. Requested superstep %d comes before current step %d\n",
                  step, sbsc->current );

    delay = step - sbsc->current;
    if ( delay >= sbsc->horizon || 
          sbsc->n_requests[ (sbsc->queue_start + delay) % sbsc->horizon ] 
            >= sbsc->max_requests_per_step ) {

        /* new memory allocation is necessary */
        bsc_step_t new_horizon;
        unsigned * new_n_requests;
        unsigned new_max_requests;
        request_t * new_queue;

        new_horizon = sbsc->horizon;
        if (delay >= sbsc->horizon) {
            new_horizon = MAX( 2*sbsc->horizon, delay + 1);
        }

        if ( new_horizon <= delay )
            bsp_abort("bsc: cannot plan that far in the future"
                      "due to integer overflow\n");
        
        new_n_requests = calloc( new_horizon, sizeof(unsigned));
        if ( ! new_n_requests ) 
            bsp_abort("bsc: insufficient memory; "
                      "cannot allocate %u x %u bytes\n",
                new_horizon, (unsigned) sizeof(unsigned) );

        for ( i = 0; i < sbsc->horizon; ++i ) {
            j = (sbsc->queue_start + i) % sbsc->horizon;
            new_n_requests[ i ] = sbsc->n_requests[j];
        }

        new_max_requests = sbsc->max_requests_per_step; 
        if (new_max_requests <= new_n_requests[delay]) 
            new_max_requests = MAX( 2 * sbsc->max_requests_per_step, 
                    new_n_requests[delay] + 1  );

        if ( new_max_requests <= new_n_requests[delay] )
            bsp_abort("bsc: cannot plan that far in the future"
                      "due to integer overflow\n");
     
        new_queue = calloc( (size_t) new_horizon * new_max_requests, 
                            sizeof(request_t) );

        for ( i = 0; i < sbsc->horizon; ++i ) {
            for ( j = 0; j < sbsc->max_requests_per_step; ++j ){
                unsigned a = i * new_max_requests + j;
                unsigned b = (i + sbsc->queue_start) % sbsc->horizon 
                              * sbsc->max_requests_per_step + j;
                new_queue[ a ] = sbsc->queue[ b ];
            }
        }

        free( sbsc->n_requests );
        free( sbsc->queue );
        sbsc->n_requests = new_n_requests;
        sbsc->queue = new_queue;
        sbsc->horizon = new_horizon;
        sbsc->max_requests_per_step = new_max_requests;
        sbsc->queue_start = 0;
    }

    i = (delay + sbsc->queue_start) % sbsc->horizon;
    entry = sbsc->queue + i * 
        sbsc->max_requests_per_step + sbsc->n_requests[i] ;
    
    sbsc->n_requests[i] += 1;
    sbsc->total_n_outstanding_requests += 1;

    return entry;
}